

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDateTime QDateTime::fromString(QString *string,QStringView format,int baseYear,QCalendar cal)

{
  bool bVar1;
  Data DVar2;
  undefined4 in_register_0000000c;
  QCalendar in_R9;
  long in_FS_OFFSET;
  QStringView newFormat;
  QDateTimeParser dt;
  QDateTime datetime;
  QLocale local_e0;
  QDateTimeParser local_d8;
  Data local_40;
  long local_38;
  
  newFormat.m_data._4_4_ = in_register_0000000c;
  newFormat.m_data._0_4_ = baseYear;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime((QDateTime *)&local_40.data);
  memset(&local_d8,0xaa,0x98);
  QDateTimeParser::QDateTimeParser(&local_d8,QDateTime,FromString,in_R9);
  QLocale::QLocale(&local_e0,C,AnyScript,AnyCountry);
  QLocale::operator=(&local_d8.defaultLocale,&local_e0);
  QLocale::~QLocale(&local_e0);
  newFormat.m_size = (qsizetype)format.m_data;
  bVar1 = QDateTimeParser::parseFormat(&local_d8,newFormat);
  if (bVar1) {
    bVar1 = QDateTimeParser::fromString
                      (&local_d8,(QString *)format.m_size,(QDateTime *)&local_40.data,(int)cal.d_ptr
                      );
    if (!bVar1) {
      DVar2 = local_40;
      if (((ulong)local_40.d & 1) == 0) {
        DVar2._4_4_ = 0;
        DVar2._0_4_ = ((local_40.d)->m_status).
                      super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      if (((ulong)DVar2.d & 8) != 0) goto LAB_0034be5d;
    }
    QDateTime((QDateTime *)string,(QDateTime *)&local_40.data);
  }
  else {
LAB_0034be5d:
    QDateTime((QDateTime *)string);
  }
  QDateTimeParser::~QDateTimeParser(&local_d8);
  ~QDateTime((QDateTime *)&local_40.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDateTime)(Data)string;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTime::fromString(const QString &string, QStringView format, int baseYear,
                                QCalendar cal)
{
#if QT_CONFIG(datetimeparser)
    QDateTime datetime;

    QDateTimeParser dt(QMetaType::QDateTime, QDateTimeParser::FromString, cal);
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format) && (dt.fromString(string, &datetime, baseYear)
                                   || !datetime.isValid())) {
        return datetime;
    }
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
    Q_UNUSED(baseYear);
    Q_UNUSED(cal);
#endif
    return QDateTime();
}